

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O2

int ecx_readPDOassign(ecx_contextt *context,uint16 Slave,uint16 PDOassign)

{
  uint8 uVar1;
  ushort index;
  int iVar2;
  ushort uVar3;
  ulong uVar4;
  int iVar5;
  ecx_contextt *context_00;
  uint uVar6;
  uint8 subcnt;
  ushort local_52;
  int rdl;
  uint16 local_4c;
  ushort local_4a;
  uint local_48;
  uint local_44;
  ecx_contextt *local_40;
  uint local_38;
  int local_34;
  
  rdl = 2;
  local_52 = 0;
  iVar5 = 0;
  local_40 = context;
  iVar2 = ecx_SDOread(context,Slave,PDOassign,'\0','\0',&rdl,&local_52,700000);
  local_4a = local_52;
  if (local_52 != 0 && 0 < iVar2) {
    iVar5 = 0;
    uVar6 = (uint)Slave;
    local_38 = (uint)PDOassign;
    local_48 = (uint)Slave;
    uVar4 = CONCAT62((int6)((ulong)&local_52 >> 0x10),1);
    context_00 = local_40;
    while ((ushort)uVar4 <= local_4a) {
      rdl = 2;
      local_52 = 0;
      ecx_SDOread(context_00,(uint16)uVar6,(uint16)local_38,(uint8)uVar4,'\0',&rdl,&local_52,700000)
      ;
      index = local_52;
      iVar2 = (int)uVar4;
      if (local_52 != 0) {
        rdl = 1;
        subcnt = '\0';
        local_4c = local_52;
        local_34 = (int)uVar4;
        ecx_SDOread(context_00,(uint16)uVar6,local_52,'\0','\0',&rdl,&subcnt,700000);
        uVar1 = subcnt;
        for (uVar3 = 0; context_00 = local_40, uVar6 = local_48, iVar2 = local_34, uVar1 != uVar3;
            uVar3 = uVar3 + 1) {
          rdl = 4;
          local_44 = 0;
          ecx_SDOread(local_40,(uint16)local_48,index,(char)uVar3 + '\x01','\0',&rdl,&local_44,
                      700000);
          if ((local_44 & 0xff) == 0xff) {
            local_4c = 0xff;
          }
          iVar5 = iVar5 + (local_44 & 0xff);
        }
      }
      uVar4 = (ulong)(iVar2 + 1);
    }
  }
  return iVar5;
}

Assistant:

int ecx_readPDOassign(ecx_contextt *context, uint16 Slave, uint16 PDOassign)
{
   uint16 idxloop, nidx, subidxloop, rdat, idx, subidx;
   uint8 subcnt;
   int wkc, bsize = 0, rdl;
   int32 rdat2;

   rdl = sizeof(rdat); rdat = 0;
   /* read PDO assign subindex 0 ( = number of PDO's) */
   wkc = ecx_SDOread(context, Slave, PDOassign, 0x00, FALSE, &rdl, &rdat, EC_TIMEOUTRXM);
   rdat = etohs(rdat);
   /* positive result from slave ? */
   if ((wkc > 0) && (rdat > 0))
   {
      /* number of available sub indexes */
      nidx = rdat;
      bsize = 0;
      /* read all PDO's */
      for (idxloop = 1; idxloop <= nidx; idxloop++)
      {
         rdl = sizeof(rdat); rdat = 0;
         /* read PDO assign */
         wkc = ecx_SDOread(context, Slave, PDOassign, (uint8)idxloop, FALSE, &rdl, &rdat, EC_TIMEOUTRXM);
         /* result is index of PDO */
         idx = etohl(rdat);
         if (idx > 0)
         {
            rdl = sizeof(subcnt); subcnt = 0;
            /* read number of subindexes of PDO */
            wkc = ecx_SDOread(context, Slave,idx, 0x00, FALSE, &rdl, &subcnt, EC_TIMEOUTRXM);
            subidx = subcnt;
            /* for each subindex */
            for (subidxloop = 1; subidxloop <= subidx; subidxloop++)
            {
               rdl = sizeof(rdat2); rdat2 = 0;
               /* read SDO that is mapped in PDO */
               wkc = ecx_SDOread(context, Slave, idx, (uint8)subidxloop, FALSE, &rdl, &rdat2, EC_TIMEOUTRXM);
               rdat2 = etohl(rdat2);
               /* extract bitlength of SDO */
               if (LO_BYTE(rdat2) < 0xff)
               {
                  bsize += LO_BYTE(rdat2);
               }
               else
               {
                  rdl = sizeof(rdat); rdat = htoes(0xff);
                  /* read Object Entry in Object database */
//                  wkc = ec_readOEsingle(idx, (uint8)SubCount, pODlist, pOElist);
                  bsize += etohs(rdat);                  
               }
            }
         }
      }
   }
   /* return total found bitlength (PDO) */
   return bsize;
}